

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int CmpNodeClass(void *p,void *va,void *vb)

{
  uint uVar1;
  int iVar2;
  fourcc_t *b;
  
  uVar1 = *(uint *)(*(long *)(*va + 8) + 8);
  iVar2 = 1;
  if (uVar1 <= *vb) {
    iVar2 = -(uint)(uVar1 < *vb);
  }
  return iVar2;
}

Assistant:

static NOINLINE int CmpNodeClass(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const node* const* a = va;
    const fourcc_t* b = vb;
    fourcc_t AClass = NodeClass_ClassId(NodeGetClass(*a));
    if (AClass > *b) return 1;
    if (AClass < *b) return -1;
    return 0;
}